

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall Clone_modelWithUnits_Test::TestBody(Clone_modelWithUnits_Test *this)

{
  string *psVar1;
  ModelPtr mClone;
  ModelPtr m;
  UnitsPtr u;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40 [2];
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Units::create();
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"jangle","");
  libcellml::NamedEntity::setName(local_20);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  psVar1 = local_30;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unique_model","");
  libcellml::Entity::setId(psVar1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  psVar1 = local_30;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::Model::clone();
  compareModel((shared_ptr *)&local_30,(shared_ptr *)&local_50);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Clone, modelWithUnits)
{
    auto m = libcellml::Model::create();
    auto u = libcellml::Units::create();

    u->setName("jangle");
    m->setId("unique_model");
    m->setName("model");

    m->addUnits(u);

    auto mClone = m->clone();

    compareModel(m, mClone);
}